

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
* __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::static_resources::get_function(static_resources *this,string_type *name,error_code *ec)

{
  int iVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_true>
  _Var2;
  long lVar3;
  undefined1 local_783;
  undefined1 local_782;
  undefined1 local_781;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined1 local_768;
  undefined4 local_767;
  undefined2 local_763;
  undefined1 local_761;
  undefined8 *local_760;
  undefined8 local_758;
  undefined8 local_750;
  undefined2 local_748;
  undefined4 local_746;
  undefined2 local_742;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined2 local_728;
  undefined4 local_726;
  undefined2 local_722;
  undefined8 *local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined1 local_708;
  undefined4 local_707;
  undefined2 local_703;
  undefined1 local_701;
  undefined4 *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined8 local_6ec;
  undefined4 local_6e4;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined4 *local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined2 local_68c;
  undefined1 local_68a;
  undefined8 local_689;
  undefined1 local_681;
  undefined4 *local_680;
  undefined8 local_678;
  undefined4 local_670;
  undefined1 local_66c;
  undefined8 local_66b;
  undefined2 local_663;
  undefined1 local_661;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined4 *local_640;
  undefined8 local_638;
  undefined4 local_630;
  undefined1 local_62c;
  undefined8 local_62b;
  undefined2 local_623;
  undefined1 local_621;
  undefined4 *local_620;
  undefined8 local_618;
  undefined4 local_610;
  undefined1 local_60c;
  undefined8 local_60b;
  undefined2 local_603;
  undefined1 local_601;
  undefined4 *local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  undefined2 local_5ec;
  undefined8 local_5ea;
  undefined2 local_5e2;
  undefined4 *local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  undefined2 local_5cc;
  undefined1 local_5ca;
  undefined8 local_5c9;
  undefined1 local_5c1;
  undefined4 *local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined8 local_5ac;
  undefined4 local_5a4;
  undefined4 *local_5a0;
  undefined8 local_598;
  undefined4 local_590;
  undefined8 local_58c;
  undefined4 local_584;
  undefined4 *local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined2 local_56c;
  undefined1 local_56a;
  undefined8 local_569;
  undefined1 local_561;
  undefined4 *local_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined8 local_54c;
  undefined4 local_544;
  undefined4 *local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined2 local_52c;
  undefined1 local_52a;
  undefined8 local_529;
  undefined1 local_521;
  undefined4 *local_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined1 local_50c;
  undefined8 local_50b;
  undefined2 local_503;
  undefined1 local_501;
  undefined4 *local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined2 local_4ec;
  undefined8 local_4ea;
  undefined2 local_4e2;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined2 local_4c8;
  undefined4 local_4c6;
  undefined2 local_4c2;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined4 local_4a7;
  undefined2 local_4a3;
  undefined1 local_4a1;
  undefined4 *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  undefined1 local_48c;
  undefined8 local_48b;
  undefined2 local_483;
  undefined1 local_481;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined8 local_46c;
  undefined4 local_464;
  undefined4 *local_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined8 local_44c;
  undefined4 local_444;
  undefined4 *local_440;
  undefined8 local_438;
  undefined4 local_430;
  undefined8 local_42c;
  undefined4 local_424;
  abs_function *local_420;
  undefined4 *local_418;
  undefined8 local_410;
  undefined4 local_408;
  undefined8 local_404;
  undefined4 local_3fc;
  avg_function *local_3f8;
  undefined4 *local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  undefined1 local_3dc;
  undefined8 local_3db;
  undefined2 local_3d3;
  undefined1 local_3d1;
  ceil_function *local_3d0;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0;
  undefined4 local_3af;
  undefined2 local_3ab;
  undefined1 local_3a9;
  contains_function *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined2 local_388;
  undefined4 local_386;
  undefined2 local_382;
  ends_with_function *local_380;
  undefined4 *local_378;
  undefined8 local_370;
  undefined4 local_368;
  undefined2 local_364;
  undefined8 local_362;
  undefined2 local_35a;
  floor_function *local_358;
  undefined4 *local_350;
  undefined8 local_348;
  undefined4 local_340;
  undefined1 local_33c;
  undefined8 local_33b;
  undefined2 local_333;
  undefined1 local_331;
  join_function *local_330;
  undefined4 *local_328;
  undefined8 local_320;
  undefined4 local_318;
  undefined2 local_314;
  undefined1 local_312;
  undefined8 local_311;
  undefined1 local_309;
  length_function *local_308;
  undefined4 *local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined4 local_2e4;
  max_function *local_2e0;
  undefined4 *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  undefined2 local_2c4;
  undefined1 local_2c2;
  undefined8 local_2c1;
  undefined1 local_2b9;
  max_by_function *local_2b8;
  undefined4 *local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  undefined8 local_29c;
  undefined4 local_294;
  map_function *local_290;
  undefined4 *local_288;
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_274;
  undefined4 local_26c;
  min_function *local_268;
  undefined4 *local_260;
  undefined8 local_258;
  undefined4 local_250;
  undefined2 local_24c;
  undefined1 local_24a;
  undefined8 local_249;
  undefined1 local_241;
  min_by_function *local_240;
  undefined4 *local_238;
  undefined8 local_230;
  undefined4 local_228;
  undefined2 local_224;
  undefined8 local_222;
  undefined2 local_21a;
  merge_function *local_218;
  undefined4 *local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined1 local_1fc;
  undefined8 local_1fb;
  undefined2 local_1f3;
  undefined1 local_1f1;
  type_function *local_1f0;
  undefined4 *local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined1 local_1d4;
  undefined8 local_1d3;
  undefined2 local_1cb;
  undefined1 local_1c9;
  sort_function *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  sort_by_function *local_1a0;
  undefined4 *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined1 local_184;
  undefined8 local_183;
  undefined2 local_17b;
  undefined1 local_179;
  keys_function *local_178;
  undefined4 *local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined2 local_15c;
  undefined1 local_15a;
  undefined8 local_159;
  undefined1 local_151;
  values_function *local_150;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  reverse_function *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined4 local_104;
  starts_with_function *local_100;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  sum_function *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined4 local_b7;
  undefined2 local_b3;
  undefined1 local_b1;
  to_array_function *local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined2 local_90;
  undefined4 local_8e;
  undefined2 local_8a;
  to_number_function *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined2 local_68;
  undefined4 local_66;
  undefined2 local_62;
  to_string_function *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined4 local_3f;
  undefined2 local_3b;
  undefined1 local_39;
  not_null_function *local_38;
  
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::abs_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   abs_func), iVar1 != 0)) {
    get_function::abs_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::abs_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::abs_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ea80;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::abs_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::avg_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   avg_func), iVar1 != 0)) {
    get_function::avg_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::avg_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::avg_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099eac8;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::avg_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::ceil_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   ceil_func), iVar1 != 0)) {
    get_function::ceil_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::ceil_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::ceil_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099eb10;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::ceil_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::contains_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   contains_func), iVar1 != 0)) {
    get_function::contains_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::contains_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::contains_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099eb58;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::contains_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
       ends_with_func == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   ends_with_func), iVar1 != 0)) {
    get_function::ends_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::ends_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::ends_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099eba0;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::ends_with_func)
    ;
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::floor_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   floor_func), iVar1 != 0)) {
    get_function::floor_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::floor_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::floor_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ebe8;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::floor_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::join_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   join_func), iVar1 != 0)) {
    get_function::join_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::join_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::join_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ec30;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::join_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::length_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   length_func), iVar1 != 0)) {
    get_function::length_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::length_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::length_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ec78;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::length_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::max_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   max_func), iVar1 != 0)) {
    get_function::max_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::max_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::max_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ecc0;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::max_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::max_by_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   max_by_func), iVar1 != 0)) {
    get_function::max_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::max_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::max_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ed08;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::max_by_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::map_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   map_func), iVar1 != 0)) {
    get_function::map_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::map_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::map_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ed50;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::map_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::merge_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   merge_func), iVar1 != 0)) {
    get_function::merge_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    get_function::merge_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ed98;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::merge_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::min_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   min_func), iVar1 != 0)) {
    get_function::min_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::min_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::min_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ede0;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::min_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::min_by_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   min_by_func), iVar1 != 0)) {
    get_function::min_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::min_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::min_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ee28;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::min_by_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::type_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   type_func), iVar1 != 0)) {
    get_function::type_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::type_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::type_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ee70;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::type_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sort_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   sort_func), iVar1 != 0)) {
    get_function::sort_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::sort_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::sort_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099eeb8;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::sort_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sort_by_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   sort_by_func), iVar1 != 0)) {
    get_function::sort_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::sort_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::sort_by_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ef00;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::sort_by_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::keys_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   keys_func), iVar1 != 0)) {
    get_function::keys_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::keys_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::keys_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ef48;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::keys_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::values_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   values_func), iVar1 != 0)) {
    get_function::values_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::values_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::values_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099ef90;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::values_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::reverse_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   reverse_func), iVar1 != 0)) {
    get_function::reverse_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::reverse_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::reverse_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099efd8;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::reverse_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
       starts_with_func == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   starts_with_func), iVar1 != 0)) {
    get_function::starts_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
    get_function::starts_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::starts_with_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f020;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::
                         starts_with_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sum_func ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   sum_func), iVar1 != 0)) {
    get_function::sum_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::sum_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::sum_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f068;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::sum_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::to_array_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   to_array_func), iVar1 != 0)) {
    get_function::to_array_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::to_array_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::to_array_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f0b0;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::to_array_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
       to_number_func == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   to_number_func), iVar1 != 0)) {
    get_function::to_number_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::to_number_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::to_number_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f0f8;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::to_number_func)
    ;
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
       to_string_func == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   to_string_func), iVar1 != 0)) {
    get_function::to_string_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
    get_function::to_string_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
    get_function::to_string_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f140;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::to_string_func)
    ;
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::not_null_func
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   not_null_func), iVar1 != 0)) {
    get_function::not_null_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    .arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    get_function::not_null_func.
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_function_base = (_func_int **)&PTR__function_base_0099f188;
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::not_null_func);
  }
  if ((jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
       ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
       functions__abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                   ::static_resources::
                                   get_function(std::__cxx11::string_const&,std::error_code&)::
                                   functions__abi_cxx11_), iVar1 != 0)) {
    local_460 = &local_450;
    local_440 = &local_430;
    local_430 = 0x736261;
    local_42c = local_44c;
    local_424 = local_444;
    local_438 = 3;
    local_458 = 0;
    local_450 = 0x736200;
    local_420 = &get_function::abs_func;
    local_480 = &local_470;
    local_418 = &local_408;
    local_408 = 0x677661;
    local_404 = local_46c;
    local_3fc = local_464;
    local_410 = 3;
    local_478 = 0;
    local_470 = 0x677600;
    local_3f8 = &get_function::avg_func;
    local_4a0 = &local_490;
    local_48c = 0;
    local_3f0 = &local_3e0;
    local_3e0 = 0x6c696563;
    local_3dc = 0;
    local_3db = local_48b;
    local_3d3 = local_483;
    local_3d1 = local_481;
    local_3e8 = 4;
    local_498 = 0;
    local_490 = 0x6c696500;
    local_3d0 = &get_function::ceil_func;
    local_4c0 = &local_4b0;
    local_4a8 = 0;
    local_3c8 = &local_3b8;
    local_3b8 = 0x736e6961746e6f63;
    local_3b0 = 0;
    local_3af = local_4a7;
    local_3ab = local_4a3;
    local_3a9 = local_4a1;
    local_3c0 = 8;
    local_4b8 = 0;
    local_4b0 = 0x736e6961746e6f00;
    local_3a8 = &get_function::contains_func;
    local_4e0 = &local_4d0;
    local_4c8 = 0x68;
    local_3a0 = &local_390;
    local_390 = 0x7469775f73646e65;
    local_388 = 0x68;
    local_386 = local_4c6;
    local_382 = local_4c2;
    local_398 = 9;
    local_4d8 = 0;
    local_4d0 = 0x7469775f73646e00;
    local_380 = &get_function::ends_with_func;
    local_500 = &local_4f0;
    local_4ec = 0x72;
    local_378 = &local_368;
    local_368 = 0x6f6f6c66;
    local_364 = 0x72;
    local_362 = local_4ea;
    local_35a = local_4e2;
    local_4f8 = 0;
    local_370 = 5;
    local_4f0 = 0x6f6f6c00;
    local_358 = &get_function::floor_func;
    local_520 = &local_510;
    local_50c = 0;
    local_350 = &local_340;
    local_340 = 0x6e696f6a;
    local_33c = 0;
    local_33b = local_50b;
    local_333 = local_503;
    local_331 = local_501;
    local_518 = 0;
    local_348 = 4;
    local_510 = 0x6e696f00;
    local_330 = &get_function::join_func;
    local_540 = &local_530;
    local_52c = 0x6874;
    local_52a = 0;
    local_328 = &local_318;
    local_318 = 0x676e656c;
    local_314 = 0x6874;
    local_312 = 0;
    local_311 = local_529;
    local_309 = local_521;
    local_538 = 0;
    local_320 = 6;
    local_530 = 0x676e6500;
    local_308 = &get_function::length_func;
    local_560 = &local_550;
    local_300 = &local_2f0;
    local_2f0 = 0x78616d;
    local_2ec = local_54c;
    local_2e4 = local_544;
    local_2f8 = 3;
    local_558 = 0;
    local_550 = 0x786100;
    local_2e0 = &get_function::max_func;
    local_580 = &local_570;
    local_56c = 0x7962;
    local_56a = 0;
    local_2d8 = &local_2c8;
    local_2c8 = 0x5f78616d;
    local_2c4 = 0x7962;
    local_2c2 = 0;
    local_2c1 = local_569;
    local_2b9 = local_561;
    local_578 = 0;
    local_2d0 = 6;
    local_570 = 0x5f786100;
    local_2b8 = &get_function::max_by_func;
    local_5a0 = &local_590;
    local_2b0 = &local_2a0;
    local_2a0 = 0x70616d;
    local_29c = local_58c;
    local_294 = local_584;
    local_2a8 = 3;
    local_598 = 0;
    local_590 = 0x706100;
    local_290 = &get_function::map_func;
    local_5c0 = &local_5b0;
    local_288 = &local_278;
    local_278 = 0x6e696d;
    local_274 = local_5ac;
    local_26c = local_5a4;
    local_5b8 = 0;
    local_280 = 3;
    local_5b0 = 0x6e6900;
    local_268 = &get_function::min_func;
    local_5e0 = &local_5d0;
    local_5cc = 0x7962;
    local_5ca = 0;
    local_260 = &local_250;
    local_250 = 0x5f6e696d;
    local_24c = 0x7962;
    local_24a = 0;
    local_249 = local_5c9;
    local_241 = local_5c1;
    local_5d8 = 0;
    local_258 = 6;
    local_5d0 = 0x5f6e6900;
    local_240 = &get_function::min_by_func;
    local_600 = &local_5f0;
    local_5ec = 0x65;
    local_238 = &local_228;
    local_228 = 0x6772656d;
    local_224 = 0x65;
    local_222 = local_5ea;
    local_5f8 = 0;
    local_21a = local_5e2;
    local_230 = 5;
    local_5f0 = 0x67726500;
    local_218 = &get_function::merge_func;
    local_620 = &local_610;
    local_60c = 0;
    local_210 = &local_200;
    local_200 = 0x65707974;
    local_1fc = 0;
    local_1fb = local_60b;
    local_1f3 = local_603;
    local_1f1 = local_601;
    local_618 = 0;
    local_208 = 4;
    local_610 = 0x65707900;
    local_1f0 = &get_function::type_func;
    local_640 = &local_630;
    local_62c = 0;
    local_1e8 = &local_1d8;
    local_1d8 = 0x74726f73;
    local_1d4 = 0;
    local_1d3 = local_62b;
    local_1cb = local_623;
    local_1c9 = local_621;
    local_1e0 = 4;
    local_638 = 0;
    local_630 = 0x74726f00;
    local_1c8 = &get_function::sort_func;
    local_660 = &local_650;
    local_1c0 = &local_1b0;
    local_1b0 = 0x79625f74726f73;
    local_1a8 = local_648;
    local_658 = 0;
    local_1b8 = 7;
    local_650 = 0x79625f74726f00;
    local_1a0 = &get_function::sort_by_func;
    local_680 = &local_670;
    local_66c = 0;
    local_198 = &local_188;
    local_188 = 0x7379656b;
    local_184 = 0;
    local_183 = local_66b;
    local_17b = local_663;
    local_179 = local_661;
    local_678 = 0;
    local_190 = 4;
    local_670 = 0x73796500;
    local_178 = &get_function::keys_func;
    local_6a0 = &local_690;
    local_68c = 0x7365;
    local_68a = 0;
    local_170 = &local_160;
    local_160 = 0x756c6176;
    local_15c = 0x7365;
    local_15a = 0;
    local_159 = local_689;
    local_151 = local_681;
    local_698 = 0;
    local_168 = 6;
    local_690 = 0x756c6100;
    local_150 = &get_function::values_func;
    local_6c0 = &local_6b0;
    local_148 = &local_138;
    local_138 = 0x65737265766572;
    local_6b8 = 0;
    local_130 = local_6a8;
    local_140 = 7;
    local_6b0 = 0x65737265766500;
    local_128 = &get_function::reverse_func;
    local_6e0 = &local_6d0;
    local_6c8 = 0x687469;
    local_120 = &local_110;
    local_110 = 0x775f737472617473;
    local_108 = 0x687469;
    local_6d8 = 0;
    local_104 = local_6c4;
    local_118 = 0xb;
    local_6d0 = 0x775f737472617400;
    local_100 = &get_function::starts_with_func;
    local_700 = &local_6f0;
    local_f8 = &local_e8;
    local_e8 = 0x6d7573;
    local_e4 = local_6ec;
    local_dc = local_6e4;
    local_f0 = 3;
    local_6f8 = 0;
    local_6f0 = 0x6d7500;
    local_d8 = &get_function::sum_func;
    local_720 = &local_710;
    local_708 = 0;
    local_d0 = &local_c0;
    local_c0 = 0x79617272615f6f74;
    local_b8 = 0;
    local_b7 = local_707;
    local_b3 = local_703;
    local_b1 = local_701;
    local_c8 = 8;
    local_718 = 0;
    local_710 = 0x79617272615f6f00;
    local_b0 = &get_function::to_array_func;
    local_740 = &local_730;
    local_728 = 0x72;
    local_a8 = &local_98;
    local_98 = 0x65626d756e5f6f74;
    local_90 = 0x72;
    local_8e = local_726;
    local_738 = 0;
    local_8a = local_722;
    local_a0 = 9;
    local_730 = 0x65626d756e5f6f00;
    local_88 = &get_function::to_number_func;
    local_760 = &local_750;
    local_748 = 0x67;
    local_80 = &local_70;
    local_70 = 0x6e697274735f6f74;
    local_68 = 0x67;
    local_66 = local_746;
    local_62 = local_742;
    local_78 = 9;
    local_758 = 0;
    local_750 = 0x6e697274735f6f00;
    local_60 = &get_function::to_string_func;
    local_780 = &local_770;
    local_768 = 0;
    local_58 = &local_48;
    local_48 = 0x6c6c756e5f746f6e;
    local_40 = 0;
    local_3f = local_767;
    local_3b = local_763;
    local_39 = local_761;
    local_50 = 8;
    local_778 = 0;
    local_770 = 0x6c6c756e5f746f00;
    local_38 = &get_function::not_null_func;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,jsoncons::jmespath::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const*>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jmespath::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _Hashtable<std::pair<std::__cxx11::string_const,jsoncons::jmespath::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const*>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,jsoncons::jmespath::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const*>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jmespath::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                   ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
                   functions__abi_cxx11_,&local_440,&stack0xffffffffffffffd0,0,&local_781,&local_782
               ,&local_783);
    lVar3 = 1000;
    do {
      std::__cxx11::string::~string((string *)((long)&local_440 + lVar3));
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != -0x28);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
                 ::~unordered_map,
                 &jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
                  functions__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::
                         functions__abi_cxx11_);
  }
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         ::static_resources::
                         get_function(std::__cxx11::string_const&,std::error_code&)::
                         functions__abi_cxx11_._M_h,name);
  if ((_Var2._M_cur == (__node_type *)0x0) &&
     (_Var2._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,name), _Var2._M_cur == (__node_type *)0x0)) {
    std::error_code::operator=(ec,unknown_function);
    return (function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
  }
  return *(function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           **)((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                      ._M_storage._M_storage + 0x20);
}

Assistant:

const function_base<Json>* get_function(const string_type& name, std::error_code& ec) const
            {
                static abs_function abs_func;
                static avg_function avg_func;
                static ceil_function ceil_func;
                static contains_function contains_func;
                static ends_with_function ends_with_func;
                static floor_function floor_func;
                static join_function join_func;
                static length_function length_func;
                static max_function max_func;
                static max_by_function max_by_func;
                static map_function map_func;
                static merge_function merge_func;
                static min_function min_func;
                static min_by_function min_by_func;
                static type_function type_func;
                static sort_function sort_func;
                static sort_by_function sort_by_func;
                static keys_function keys_func;
                static values_function values_func;
                static reverse_function reverse_func;
                static starts_with_function starts_with_func;
                static const sum_function sum_func;
                static to_array_function to_array_func;
                static to_number_function to_number_func;
                static to_string_function to_string_func;
                static not_null_function not_null_func;

                using function_dictionary = std::unordered_map<string_type,const function_base<Json>*>;
                static const function_dictionary functions_ =
                {
                    {string_type{'a','b','s'}, &abs_func},
                    {string_type{'a','v','g'}, &avg_func},
                    {string_type{'c','e','i', 'l'}, &ceil_func},
                    {string_type{'c','o','n', 't', 'a', 'i', 'n', 's'}, &contains_func},
                    {string_type{'e','n','d', 's', '_', 'w', 'i', 't', 'h'}, &ends_with_func},
                    {string_type{'f','l','o', 'o', 'r'}, &floor_func},
                    {string_type{'j','o','i', 'n'}, &join_func},
                    {string_type{'l','e','n', 'g', 't', 'h'}, &length_func},
                    {string_type{'m','a','x'}, &max_func},
                    {string_type{'m','a','x','_','b','y'}, &max_by_func},
                    {string_type{'m','a','p'}, &map_func},
                    {string_type{'m','i','n'}, &min_func},
                    {string_type{'m','i','n','_','b','y'}, &min_by_func},
                    {string_type{'m','e','r', 'g', 'e'}, &merge_func},
                    {string_type{'t','y','p', 'e'}, &type_func},
                    {string_type{'s','o','r', 't'}, &sort_func},
                    {string_type{'s','o','r', 't','_','b','y'}, &sort_by_func},
                    {string_type{'k','e','y', 's'}, &keys_func},
                    {string_type{'v','a','l', 'u','e','s'}, &values_func},
                    {string_type{'r','e','v', 'e', 'r', 's','e'}, &reverse_func},
                    {string_type{'s','t','a', 'r','t','s','_','w','i','t','h'}, &starts_with_func},
                    {string_type{'s','u','m'}, &sum_func},
                    {string_type{'t','o','_','a','r','r','a','y',}, &to_array_func},
                    {string_type{'t','o','_', 'n', 'u', 'm','b','e','r'}, &to_number_func},
                    {string_type{'t','o','_', 's', 't', 'r','i','n','g'}, &to_string_func},
                    {string_type{'n','o','t', '_', 'n', 'u','l','l'}, &not_null_func}
                };

                auto it = functions_.find(name);
                if (it != functions_.end())
                {
                    return (*it).second;
                }
                auto it2 = custom_functions_.find(name);
                if (it2 == custom_functions_.end())
                {
                    ec = jmespath_errc::unknown_function;
                    return nullptr;
                }
                return it2->second.get();
            }